

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

int __thiscall clask::_func_t::handle(_func_t *this,int s,request *req,bool *keep_alive)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  pointer s_00;
  __string_type res_headers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> res;
  ostringstream os;
  string local_268;
  response local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  response_writer local_1a8 [7];
  
  if ((this->f_string).super__Function_base._M_manager == (_Manager_type)0x0) {
    if ((this->f_writer).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_1a8[0]._vptr_response_writer = (_func_int **)&PTR_write_0013c9c8;
      local_1a8[0].headers.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1a8[0].headers.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8[0].headers.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8[0].header_out = false;
      local_1a8[0].code = 200;
      local_1a8[0].s = s;
      std::function<void_(clask::response_writer_&,_clask::request_&)>::operator()
                (&this->f_writer,local_1a8,req);
      iVar1 = local_1a8[0].code;
      *keep_alive = false;
      response_writer::~response_writer(local_1a8);
      return iVar1;
    }
    if ((this->f_response).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<clask::response_(clask::request_&)>::operator()
                (&local_248,&this->f_response,req);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar3 = std::operator<<((ostream *)local_1a8,"HTTP/1.1 ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_248.code);
      poVar3 = std::operator<<(poVar3," ");
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)status_codes_abi_cxx11_,&local_248.code);
      poVar3 = std::operator<<(poVar3,(string *)pmVar4);
      std::operator<<(poVar3,"\r\n");
      for (s_00 = local_248.headers.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          s_00 != local_248.headers.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; s_00 = s_00 + 1) {
        camelize(&local_268,&s_00->first);
        bVar2 = std::operator==(&local_268,"Content-Length");
        if (!bVar2) {
          std::operator+(&local_208,&local_268,": ");
          std::operator+(&local_1e8,&local_208,&s_00->second);
          std::operator+(&local_1c8,&local_1e8,"\r\n");
          std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_208);
        }
        std::__cxx11::string::~string((string *)&local_268);
      }
      poVar3 = std::operator<<((ostream *)local_1a8,"Content-Length: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"\r\n\r\n");
      std::__cxx11::stringbuf::str();
      send(s,local_268._M_dataplus._M_p,(long)(int)local_268._M_string_length,0x4000);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      response::~response(&local_248);
      return local_248.code;
    }
  }
  else {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
    ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_248,
                 &this->f_string,req);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "HTTP/1.1 200 OK\r\nContent-Type: text/plain; charset=UTF-8\r\n");
    poVar3 = std::operator<<((ostream *)local_1a8,"Connection: ");
    pcVar5 = "Close";
    if (*keep_alive != false) {
      pcVar5 = "Keep-Alive";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::operator<<(poVar3,"\r\n");
    poVar3 = std::operator<<((ostream *)local_1a8,"Content-Length: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\r\n\r\n");
    std::__cxx11::stringbuf::str();
    send(s,local_268._M_dataplus._M_p,(long)(int)local_268._M_string_length,0x4000);
    send(s,(void *)CONCAT44(local_248._4_4_,local_248.code),
         (long)(int)local_248.content._M_dataplus._M_p,0x4000);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::__cxx11::string::~string((string *)&local_248);
  }
  return 200;
}

Assistant:

inline int func_t::handle(int s, request& req, bool& keep_alive) const {
  int code = 200;
  if (f_string != nullptr) {
    auto res = f_string(req);
    std::ostringstream os;
    os << "HTTP/1.1 200 OK\r\nContent-Type: text/plain; charset=UTF-8\r\n";
    os << "Connection: " << (keep_alive ? "Keep-Alive" : "Close") << "\r\n";
    os << "Content-Length: " << res.size() << "\r\n\r\n";
    auto res_headers = os.str();
    send(s, res_headers.data(), (int) res_headers.size(), MSG_NOSIGNAL);
    send(s, res.data(), (int) res.size(), MSG_NOSIGNAL);
  } else if (f_writer != nullptr) {
    response_writer writer(s, 200);
    f_writer(writer, req);
    keep_alive = false;
    code = writer.code;
  } else if (f_response != nullptr) {
    auto res = f_response(req);
    std::ostringstream os;
    os << "HTTP/1.1 " << res.code << " " << status_codes[res.code] << "\r\n";
    for (auto& h : res.headers) {
      auto key = camelize(h.first);
      if (key == "Content-Length")
        continue;
      os << key + ": " + h.second + "\r\n";
    }
    os << "Content-Length: " << res.content.size() << "\r\n\r\n";
    auto res_headers = os.str();
    send(s, res_headers.data(), (int) res_headers.size(), MSG_NOSIGNAL);
    code = res.code;
  }
  return code;
}